

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void doctest::anon_unknown_15::FatalConditionHandler::reset(void)

{
  undefined1 *__act;
  long lVar1;
  
  if ((anonymous_namespace)::FatalConditionHandler::isSet == '\x01') {
    __act = (anonymous_namespace)::FatalConditionHandler::oldSigActions;
    lVar1 = 0;
    do {
      sigaction(*(int *)((long)&(anonymous_namespace)::signalDefs + lVar1),(sigaction *)__act,
                (sigaction *)0x0);
      lVar1 = lVar1 + 0x10;
      __act = (undefined1 *)((long)__act + 0x98);
    } while (lVar1 != 0x60);
    sigaltstack((sigaltstack *)(anonymous_namespace)::FatalConditionHandler::oldSigStack,
                (sigaltstack *)0x0);
    (anonymous_namespace)::FatalConditionHandler::isSet = '\0';
  }
  return;
}

Assistant:

static void reset() {
            if(isSet) {
                // Set signals back to previous values -- hopefully nobody overwrote them in the meantime
                for(std::size_t i = 0; i < DOCTEST_COUNTOF(signalDefs); ++i) {
                    sigaction(signalDefs[i].id, &oldSigActions[i], nullptr);
                }
                // Return the old stack
                sigaltstack(&oldSigStack, nullptr);
                isSet = false;
            }
        }